

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

MixingHashState
absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
          (MixingHashState hash_state,uchar *first,size_t size)

{
  uint64_t state;
  size_t size_local;
  uchar *first_local;
  MixingHashState hash_state_local;
  
  state = CombineContiguousImpl(hash_state.state_,first,size);
  MixingHashState(&hash_state_local,state);
  return (MixingHashState)hash_state_local.state_;
}

Assistant:

static MixingHashState combine_contiguous(MixingHashState hash_state,
                                            const unsigned char* first,
                                            size_t size) {
    return MixingHashState(
        CombineContiguousImpl(hash_state.state_, first, size,
                              std::integral_constant<int, sizeof(size_t)>{}));
  }